

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.
                              super_IfcObject + -0x18);
  plVar1 = (long *)(&(this->super_IfcReinforcingElement).field_0x178 + lVar2);
  plVar1[-0x2f] = 0x870a80;
  plVar1[0xf] = 0x870bc0;
  plVar1[-0x1e] = 0x870aa8;
  plVar1[-0x1c] = 0x870ad0;
  plVar1[-0x15] = 0x870af8;
  plVar1[-0xf] = 0x870b20;
  plVar1[-8] = 0x870b48;
  plVar1[-6] = 0x870b70;
  plVar1[-4] = 0x870b98;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)
             ((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                     super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                     field_0x0 + lVar2),&PTR_construction_vtable_24__00870848);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}